

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity.cxx
# Opt level: O0

void __thiscall xray_re::cse_alife_trader::state_read(cse_alife_trader *this)

{
  uint16_t in_DX;
  xr_packet *in_RSI;
  
  state_read((cse_alife_trader *)
             &this[-1].super_cse_alife_dynamic_object_visual.super_cse_alife_dynamic_object.
              super_cse_alife_object.super_cse_abstract.m_ini_string.field_2,in_RSI,in_DX);
  return;
}

Assistant:

void cse_alife_trader::state_read(xr_packet& packet, uint16_t size)
{
	cse_alife_dynamic_object_visual::state_read(packet, size);
	cse_alife_trader_abstract::state_read(packet, size);
	if (m_version > CSE_VERSION_0x23 && m_version < CSE_VERSION_0x76)	// m_tOrdID
		packet.r_u32();
	if (m_version > CSE_VERSION_0x1d && m_version < CSE_VERSION_0x76) {	// m_tpOrderedArtefacts
		for (uint_fast32_t n = packet.r_u32(); n; --n) {
			packet.skip_sz();
			packet.r_u32();
			for (size_t k = packet.r_u32(); k; --k) {
				packet.skip_sz();
				packet.r_u32();
				packet.r_u32();
			}
		}
	}
	if (m_version > CSE_VERSION_0x1e && m_version < CSE_VERSION_0x76) {	// m_tSupplies
		for (uint_fast32_t n = packet.r_u32(); n; --n) {
			packet.skip_sz();
			packet.r_u32();
			packet.r_float();
			packet.r_float();
		}
	}
}